

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

void factor(item *x)

{
  bool bVar1;
  item *x_00;
  object *y;
  object **ppoVar2;
  object *fp;
  procFixStruct *ppVar3;
  procFixStruct *ppVar4;
  int iVar5;
  int iVar6;
  char *msg;
  
  x_00 = (item *)calloc(1,0x30);
  if (currentSymbol < 0x1f6) {
    if (currentSymbol == 0x12d) {
      getSymbol();
      expression(x);
      if (currentSymbol != 0x12e) {
        msg = "missing right paranetheses";
        goto LAB_001071c3;
      }
      goto LAB_001070a9;
    }
    if (currentSymbol == 0x1f5) {
      y = find();
      getSymbol();
      makeItem(x,y);
      if (x->mode == 0x2c4) {
        param(x_00);
        if (y->val < 7) {
          IOCall(x,x_00);
          return;
        }
        return;
      }
      if (x->mode != 0x2c0) {
        selector(x);
        return;
      }
      ppoVar2 = &y->dsc;
      if (y->val < 0) {
        ppoVar2 = &(*ppoVar2)->next;
      }
      fp = *ppoVar2;
      if (currentSymbol == 0x12d) {
        getSymbol();
        if (currentSymbol != 0x12e) {
          fp = parameter(fp);
          do {
            bVar1 = true;
            if (currentSymbol == 0xcc) {
LAB_0010711c:
              getSymbol();
            }
            else if (currentSymbol == 0x12e) {
              bVar1 = false;
              goto LAB_0010711c;
            }
            if (!bVar1) goto LAB_00107136;
            fp = parameter(fp);
          } while( true );
        }
        getSymbol();
      }
LAB_00107136:
      iVar6 = pc;
      if (fp->cl == 0x2c1) {
        if (fp->val < 1) goto LAB_00107148;
      }
      else if (fp->cl != 0x2c5) {
LAB_00107148:
        ppVar4 = procFixList;
        if (y->val < 0) {
          do {
            ppVar3 = ppVar4;
            ppVar4 = ppVar3->next;
          } while (ppVar4 != (procFixStruct *)0x0);
          ppVar4 = (procFixStruct *)calloc(1,0x18);
          ppVar4->pos = iVar6;
          ppVar4->proc = y;
          ppVar3->next = ppVar4;
          ppVar4->next = (procFixStruct *)0x0;
          iVar6 = 0;
        }
        else {
          iVar6 = x->a - pc;
        }
        put(0x2e,0,0,iVar6);
        return;
      }
      msg = "too few parameters";
      goto LAB_001071c3;
    }
LAB_001071bc:
    msg = "factor ?";
LAB_001071c3:
    mark(msg);
    exit(-1);
  }
  iVar6 = intTypeIndex;
  iVar5 = numberVal;
  if (currentSymbol != 0x1f6) {
    if (currentSymbol != 0x1f8) goto LAB_001071bc;
    iVar6 = charTypeIndex;
    iVar5 = (int)idName[0];
  }
  x->mode = 0x2bd;
  x->typeIndex = iVar6;
  x->a = iVar5;
  x->b = 0;
  x->c = 0;
  x->idx = 0;
  x->lev = 0;
  x->r = 0;
LAB_001070a9:
  getSymbol();
  return;
}

Assistant:

procedure 
void factor(struct item *x) {
	variable struct object *obj; variable struct object *par; variable struct object *procObj;
	variable struct item *y;
	variable bool cond;
	variable int jumpTo;
	obj = NULL; par = NULL; procObj = NULL; cond = true; jumpTo = 0; 
	allocMem(y);
	if (currentSymbol == SYMBOL_IDENTIFIER) {
		obj = find();
		getSymbol();
		makeItem(x,obj);
		if (x->mode == CLASS_PROC) { 
			procObj = obj;
			if (procObj->val < 0) { /* prototype => dsc still points to head for further use */
				par = obj->dsc->next;
			} else {
				par = obj->dsc;
			}
			if (currentSymbol == SYMBOL_LPARAN) { 
				getSymbol(); 
				if (currentSymbol == SYMBOL_RPARAN) {
					getSymbol();
				} else {
					par = parameter(par);
					while (cond == true) {
						if (currentSymbol == SYMBOL_COMMA) {
							getSymbol();
						} elsif (currentSymbol == SYMBOL_RPARAN) {
							getSymbol();
							cond = false;
						}
						if (cond == true) {
							par = parameter(par);
						}
					}
				}
			}
			if (isParameter(par) != true) {
				if (procObj->val < 0) {
					addProcToFixList(pc,procObj);
					jumpTo = 0;
				} else {
					jumpTo = x->a - pc;
				}
				call(x,jumpTo);
			} else {
				mark("too few parameters");
				exit(-1);
			}
		} elsif (x->mode == CLASS_SPROC) { 
			param(y);
			if (obj->val <= 6) {
				IOCall(x,y);
			}
		} else {
			selector(x);
		}
	}